

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_accumulation.cc
# Opt level: O3

bool __thiscall
sptk::ProductAccumulation::Run
          (ProductAccumulation *this,vector<double,_std::allocator<double>_> *data,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  size_type __new_size;
  double *pdVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  if (this->is_valid_ == true) {
    bVar10 = false;
    if ((buffer != (Buffer *)0x0) &&
       (__new_size = (long)this->num_order_ + 1, bVar10 = false,
       (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == __new_size)) {
      this_00 = &buffer->interim_;
      if ((long)(buffer->interim_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->interim_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
        auVar6 = _DAT_0010c510;
        auVar5 = _DAT_0010c500;
        pdVar2 = (buffer->interim_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (buffer->interim_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pdVar2 != pdVar3) {
          uVar8 = (long)pdVar3 + (-8 - (long)pdVar2);
          auVar15._8_4_ = (int)uVar8;
          auVar15._0_8_ = uVar8;
          auVar15._12_4_ = (int)(uVar8 >> 0x20);
          auVar13._0_8_ = uVar8 >> 3;
          auVar13._8_8_ = auVar15._8_8_ >> 3;
          uVar9 = 0;
          auVar13 = auVar13 ^ _DAT_0010c510;
          do {
            auVar14._8_4_ = (int)uVar9;
            auVar14._0_8_ = uVar9;
            auVar14._12_4_ = (int)(uVar9 >> 0x20);
            auVar15 = (auVar14 | auVar5) ^ auVar6;
            if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                        auVar13._4_4_ < auVar15._4_4_) & 1)) {
              pdVar2[uVar9] = 1.0;
            }
            if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
                auVar15._12_4_ <= auVar13._12_4_) {
              pdVar2[uVar9 + 1] = 1.0;
            }
            uVar9 = uVar9 + 2;
          } while (((uVar8 >> 3) + 2 & 0xfffffffffffffffe) != uVar9);
        }
      }
      buffer->num_data_ = buffer->num_data_ + 1;
      pdVar11 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar4 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (this->numerically_stable_ == true) {
        bVar10 = true;
        if (pdVar11 != pdVar4) {
          pdVar7 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            dVar1 = *pdVar7;
            dVar12 = log(*pdVar11);
            *pdVar7 = dVar12 + dVar1;
            pdVar11 = pdVar11 + 1;
            pdVar7 = pdVar7 + 1;
          } while (pdVar11 != pdVar4);
        }
      }
      else {
        bVar10 = true;
        if (pdVar11 != pdVar4) {
          pdVar7 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            *pdVar7 = *pdVar11 * *pdVar7;
            pdVar11 = pdVar11 + 1;
            pdVar7 = pdVar7 + 1;
          } while (pdVar11 != pdVar4);
        }
      }
    }
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool ProductAccumulation::Run(const std::vector<double>& data,
                              ProductAccumulation::Buffer* buffer) const {
  // Check inputs.
  const std::size_t length(num_order_ + 1);
  if (!is_valid_ || data.size() != length || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->interim_.size() != length) {
    buffer->interim_.resize(length);
    std::fill(buffer->interim_.begin(), buffer->interim_.end(), 1.0);
  }

  ++(buffer->num_data_);

  if (numerically_stable_) {
    std::transform(data.begin(), data.end(), buffer->interim_.begin(),
                   buffer->interim_.begin(),
                   [](double x, double y) { return std::log(x) + y; });
  } else {
    std::transform(data.begin(), data.end(), buffer->interim_.begin(),
                   buffer->interim_.begin(), std::multiplies<double>());
  }

  return true;
}